

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O1

wchar_t archive_match_include_time(archive *_a,wchar_t flag,time_t sec,long nsec)

{
  wchar_t wVar1;
  
  wVar1 = validate_time_flag(_a,flag,"archive_match_include_time");
  if (wVar1 == L'\0') {
    set_timefilter((archive_match *)_a,flag,sec,nsec,sec,nsec);
    wVar1 = L'\0';
  }
  return wVar1;
}

Assistant:

int
archive_match_include_time(struct archive *_a, int flag, time_t sec,
    long nsec)
{
	int r;

	r = validate_time_flag(_a, flag, "archive_match_include_time");
	if (r != ARCHIVE_OK)
		return (r);
	return set_timefilter((struct archive_match *)_a, flag,
			sec, nsec, sec, nsec);
}